

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleditemdelegate.cpp
# Opt level: O2

bool __thiscall
QStyledItemDelegate::editorEvent
          (QStyledItemDelegate *this,QEvent *event,QAbstractItemModel *model,
          QStyleOptionViewItem *option,QModelIndex *index)

{
  QWidget *this_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  char cVar4;
  undefined1 uVar5;
  uint uVar6;
  CheckState CVar7;
  QStyle *pQVar8;
  int iVar9;
  long in_FS_OFFSET;
  bool bVar10;
  QPointF QVar11;
  QPointF local_150;
  QPoint local_140;
  undefined1 local_138 [16];
  QStyleOptionViewItem viewOpt;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = (**(code **)(*(long *)model + 0x138))(model,index);
  auVar3._8_8_ = local_138._8_8_;
  auVar3._0_8_ = local_138._0_8_;
  auVar2._8_8_ = local_138._8_8_;
  auVar2._0_8_ = local_138._0_8_;
  if ((uVar6 & 0x10) == 0) {
    uVar5 = 0;
    local_138 = auVar2;
    goto LAB_00508ce0;
  }
  uVar5 = 0;
  if (((uVar6 & 0x20) == 0) ||
     (local_138 = auVar3,
     ((option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
      super_QFlagsStorage<QStyle::StateFlag>.i & 1) == 0)) goto LAB_00508ce0;
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::data((QVariant *)&local_58,index,10);
  if (puStack_40 < (undefined1 *)0x4) {
LAB_00508c62:
    uVar5 = 0;
  }
  else {
    this_00 = option->widget;
    if (this_00 == (QWidget *)0x0) {
      pQVar8 = QApplication::style();
    }
    else {
      pQVar8 = QWidget::style(this_00);
    }
    auVar1._8_8_ = local_138._8_8_;
    auVar1._0_8_ = local_138._0_8_;
    if (*(ushort *)(event + 8) - 2 < 3) {
      memset(&viewOpt,0xaa,0xd0);
      QStyleOptionViewItem::QStyleOptionViewItem(&viewOpt,option);
      (**(code **)(*(long *)this + 0xb8))(this,&viewOpt,index);
      local_138 = (**(code **)(*(long *)pQVar8 + 0xc0))(pQVar8,0x17,&viewOpt,this_00);
      if (*(int *)(event + 0x40) == 1) {
        QVar11 = QSinglePointEvent::position((QSinglePointEvent *)event);
        local_150.yp = QVar11.yp;
        local_150.xp = QVar11.xp;
        local_140 = QPointF::toPoint(&local_150);
        bVar10 = false;
        cVar4 = QRect::contains((QPoint *)local_138,SUB81(&local_140,0));
        uVar5 = 0;
        if (cVar4 != '\0') {
          bVar10 = (*(int *)(event + 8) - 2U & 0xfffd) != 0;
          uVar5 = 1;
        }
      }
      else {
        bVar10 = false;
        uVar5 = 0;
      }
      QStyleOptionViewItem::~QStyleOptionViewItem(&viewOpt);
      if (!bVar10) goto LAB_00508cd3;
    }
    else if ((*(ushort *)(event + 8) != 6) ||
            ((*(int *)(event + 0x40) != 0x1010000 &&
             (local_138 = auVar1, *(int *)(event + 0x40) != 0x20)))) goto LAB_00508c62;
    CVar7 = QtPrivate::legacyEnumValueFromModelData<Qt::CheckState>((QVariant *)&local_58);
    if ((uVar6 >> 8 & 1) == 0) {
      iVar9 = (uint)(CVar7 != Checked) * 2;
    }
    else {
      iVar9 = (int)(CVar7 + PartiallyChecked) % 3;
    }
    ::QVariant::QVariant((QVariant *)&viewOpt,iVar9);
    uVar5 = (**(code **)(*(long *)model + 0x98))(model,index,&viewOpt,10);
    ::QVariant::~QVariant((QVariant *)&viewOpt);
  }
LAB_00508cd3:
  ::QVariant::~QVariant((QVariant *)&local_58);
LAB_00508ce0:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)uVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool QStyledItemDelegate::editorEvent(QEvent *event,
                                QAbstractItemModel *model,
                                const QStyleOptionViewItem &option,
                                const QModelIndex &index)
{
    Q_ASSERT(event);
    Q_ASSERT(model);

    // make sure that the item is checkable
    Qt::ItemFlags flags = model->flags(index);
    if (!(flags & Qt::ItemIsUserCheckable) || !(option.state & QStyle::State_Enabled)
        || !(flags & Qt::ItemIsEnabled))
        return false;

    // make sure that we have a check state
    QVariant value = index.data(Qt::CheckStateRole);
    if (!value.isValid())
        return false;

    const QWidget *widget = QStyledItemDelegatePrivate::widget(option);
    QStyle *style = widget ? widget->style() : QApplication::style();

    // make sure that we have the right event type
    if ((event->type() == QEvent::MouseButtonRelease)
        || (event->type() == QEvent::MouseButtonDblClick)
        || (event->type() == QEvent::MouseButtonPress)) {
        QStyleOptionViewItem viewOpt(option);
        initStyleOption(&viewOpt, index);
        QRect checkRect = style->subElementRect(QStyle::SE_ItemViewItemCheckIndicator, &viewOpt, widget);
        QMouseEvent *me = static_cast<QMouseEvent*>(event);
        if (me->button() != Qt::LeftButton || !checkRect.contains(me->position().toPoint()))
            return false;

        if ((event->type() == QEvent::MouseButtonPress)
            || (event->type() == QEvent::MouseButtonDblClick))
            return true;

    } else if (event->type() == QEvent::KeyPress) {
        if (static_cast<QKeyEvent*>(event)->key() != Qt::Key_Space
         && static_cast<QKeyEvent*>(event)->key() != Qt::Key_Select)
            return false;
    } else {
        return false;
    }

    Qt::CheckState state = QtPrivate::legacyEnumValueFromModelData<Qt::CheckState>(value);
    if (flags & Qt::ItemIsUserTristate)
        state = ((Qt::CheckState)((state + 1) % 3));
    else
        state = (state == Qt::Checked) ? Qt::Unchecked : Qt::Checked;
    return model->setData(index, state, Qt::CheckStateRole);
}